

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z2_Nx4_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [32];
  uint uVar14;
  int iVar15;
  int iVar16;
  long in_RCX;
  long in_RDX;
  undefined2 in_SI;
  undefined6 in_register_00000032;
  int in_EDI;
  undefined2 in_R8W;
  undefined6 in_register_00000082;
  uint in_R9D;
  undefined1 auVar17 [16];
  byte bStack0000000000000008;
  __m128i mask128;
  __m128i base_y_c128;
  __m128i y_c128;
  __m128i dy128;
  __m128i c1234;
  __m128i r6;
  __m128i shifty;
  __m128i a1_y;
  __m128i a0_y;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  __m128i a1_x128;
  __m128i a0_x128;
  __m128i resxy;
  __m128i resy;
  __m128i resx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  __m128i min_base_y128;
  __m128i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1_x;
  __m256i a0_x;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  short local_940;
  short sStack_93e;
  short sStack_93c;
  short sStack_93a;
  undefined1 local_8d0 [16];
  int local_8a0;
  int local_89c;
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined8 local_870;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined1 local_840 [32];
  undefined1 auStack_810 [16];
  int local_7c4;
  undefined1 local_740 [32];
  undefined1 local_720 [44];
  ushort local_6f4;
  byte local_6ec;
  undefined8 *local_6d0;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  
  local_6d0 = (undefined8 *)CONCAT62(in_register_00000032,in_SI);
  lVar9 = CONCAT62(in_register_00000082,in_R8W);
  local_6ec = (byte)in_R9D;
  iVar16 = -(1 << (local_6ec & 0x1f));
  uVar14 = -(1 << (bStack0000000000000008 & 0x1f));
  auVar1 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar1 = vpinsrw_avx(auVar1,0x10,2);
  auVar1 = vpinsrw_avx(auVar1,0x10,3);
  auVar1 = vpinsrw_avx(auVar1,0x10,4);
  auVar1 = vpinsrw_avx(auVar1,0x10,5);
  auVar1 = vpinsrw_avx(auVar1,0x10,6);
  auVar1 = vpinsrw_avx(auVar1,0x10,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar2 = vpinsrw_avx(auVar2,0x10,2);
  auVar2 = vpinsrw_avx(auVar2,0x10,3);
  auVar2 = vpinsrw_avx(auVar2,0x10,4);
  auVar2 = vpinsrw_avx(auVar2,0x10,5);
  auVar2 = vpinsrw_avx(auVar2,0x10,6);
  auVar2 = vpinsrw_avx(auVar2,0x10,7);
  uStack_4d0 = auVar2._0_8_;
  uStack_4c8 = auVar2._8_8_;
  auVar2 = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar2 = vpinsrw_avx(auVar2,0x3f,2);
  auVar2 = vpinsrw_avx(auVar2,0x3f,3);
  auVar2 = vpinsrw_avx(auVar2,0x3f,4);
  auVar2 = vpinsrw_avx(auVar2,0x3f,5);
  auVar2 = vpinsrw_avx(auVar2,0x3f,6);
  auVar2 = vpinsrw_avx(auVar2,0x3f,7);
  local_6f4 = (ushort)uVar14;
  auVar3 = vpinsrw_avx(ZEXT216(local_6f4),uVar14 & 0xffff,1);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,2);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,3);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,4);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,5);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,6);
  auVar3 = vpinsrw_avx(auVar3,uVar14 & 0xffff,7);
  for (local_7c4 = 0; local_7c4 < in_EDI; local_7c4 = local_7c4 + 1) {
    iVar15 = -(local_7c4 + 1) * upsample_left >> (6 - local_6ec & 0x1f);
    local_89c = 0;
    if (iVar15 < iVar16 + -1) {
      local_89c = (iVar16 - iVar15) + -1 >> (local_6ec & 0x1f);
    }
    local_8a0 = (int)((iVar16 - iVar15) + in_R9D) >> (local_6ec & 0x1f);
    if (local_8a0 < 5) {
      if (local_8a0 < 0) {
        local_8a0 = 0;
      }
    }
    else {
      local_8a0 = 4;
    }
    if (local_89c < 4) {
      auVar17 = *(undefined1 (*) [16])(in_RCX + (long)iVar15 * 2 + (long)local_89c * 2);
      sVar10 = (short)upsample_left;
      sVar12 = (short)(local_7c4 + 1);
      if (in_R9D == 0) {
        local_880 = vpshufb_avx(auVar17,(undefined1  [16])HighbdLoadMaskx[local_89c]);
        local_890 = vpsrldq_avx(local_880,2);
        sVar11 = sVar12 * sVar10;
        auVar17 = vpinsrw_avx(ZEXT216((ushort)(-sVar12 * sVar10)),(uint)(ushort)(0x40 - sVar11),1);
        auVar17 = vpinsrw_avx(auVar17,(uint)(ushort)(0x80 - sVar11),2);
        auVar17 = vpinsrw_avx(auVar17,(uint)(ushort)(0xc0 - sVar11),3);
        auVar17 = vpinsrw_avx(auVar17,0,4);
        auVar17 = vpinsrw_avx(auVar17,0,5);
        auVar17 = vpinsrw_avx(auVar17,0,6);
        auVar17 = vpinsrw_avx(auVar17,0,7);
        auVar17 = vpand_avx(auVar17,auVar2);
        auVar17 = vpsrlw_avx(auVar17,ZEXT416(1));
      }
      else {
        local_880 = vpshufb_avx(auVar17,(undefined1  [16])HighbdEvenOddMaskx4[local_89c]);
        local_890 = vpsrldq_avx(local_880,8);
        sVar11 = sVar12 * sVar10;
        auVar17 = vpinsrw_avx(ZEXT216((ushort)(-sVar12 * sVar10)),(uint)(ushort)(0x40 - sVar11),1);
        auVar17 = vpinsrw_avx(auVar17,(uint)(ushort)(0x80 - sVar11),2);
        auVar17 = vpinsrw_avx(auVar17,(uint)(ushort)(0xc0 - sVar11),3);
        auVar17 = vpinsrw_avx(auVar17,0,4);
        auVar17 = vpinsrw_avx(auVar17,0,5);
        auVar17 = vpinsrw_avx(auVar17,0,6);
        auVar17 = vpinsrw_avx(auVar17,0,7);
        auVar17 = vpsllw_avx(auVar17,ZEXT416(in_R9D));
        auVar17 = vpand_avx(auVar17,auVar2);
        auVar17 = vpsrlw_avx(auVar17,ZEXT416(1));
      }
      local_720._16_16_ = auVar17;
      local_720._0_16_ = local_880;
    }
    else {
      local_720._0_16_ = ZEXT816(0);
      local_720._0_32_ = ZEXT1632(local_720._0_16_);
      local_740._0_16_ = ZEXT816(0);
      local_840._0_16_ = ZEXT816(0);
      auVar17 = local_840._0_16_;
      local_890 = local_740._0_16_;
    }
    local_840 = ZEXT1632(auVar17);
    local_740 = ZEXT1632(local_890);
    if (iVar15 < iVar16) {
      uVar14 = local_7c4 << 6;
      auVar4 = vpinsrw_avx(ZEXT216((ushort)uVar14),uVar14 & 0xffff,1);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,2);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,3);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,4);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,5);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,6);
      auVar4 = vpinsrw_avx(auVar4,uVar14 & 0xffff,7);
      auVar5 = vpinsrw_avx(ZEXT216((ushort)dx),dx & 0xffff,1);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,2);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,3);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,4);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,5);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,6);
      auVar5 = vpinsrw_avx(auVar5,dx & 0xffff,7);
      auVar6 = vpinsrw_avx(ZEXT216(1),2,1);
      auVar6 = vpinsrw_avx(auVar6,3,2);
      auVar6 = vpinsrw_avx(auVar6,4,3);
      auVar6 = vpinsrw_avx(auVar6,0,4);
      auVar6 = vpinsrw_avx(auVar6,0,5);
      auVar6 = vpinsrw_avx(auVar6,0,6);
      auVar6 = vpinsrw_avx(auVar6,0,7);
      auVar5 = vpmullw_avx(auVar6,auVar5);
      auVar6 = vpsubw_avx(auVar4,auVar5);
      auVar5 = vpsraw_avx(auVar6,ZEXT416(6 - _bStack0000000000000008));
      auVar4 = vpcmpgtw_avx(auVar3,auVar5);
      auVar4 = vpandn_avx(auVar4,auVar5);
      sStack_93a = auVar4._6_2_;
      sStack_93c = auVar4._4_2_;
      sStack_93e = auVar4._2_2_;
      local_940 = auVar4._0_2_;
      auVar4 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar9 + (long)local_940 * 2)),
                           (uint)*(ushort *)(lVar9 + (long)sStack_93e * 2),1);
      auVar4 = vpinsrw_avx(auVar4,(uint)*(ushort *)(lVar9 + (long)sStack_93c * 2),2);
      auVar4 = vpinsrw_avx(auVar4,(uint)*(ushort *)(lVar9 + (long)sStack_93a * 2),3);
      auVar4 = vpinsrw_avx(auVar4,0,4);
      auVar4 = vpinsrw_avx(auVar4,0,5);
      auVar4 = vpinsrw_avx(auVar4,0,6);
      auVar4 = vpinsrw_avx(auVar4,0,7);
      auVar5 = vpinsrw_avx(ZEXT216(*(ushort *)(lVar9 + 2 + (long)local_940 * 2)),
                           (uint)*(ushort *)(lVar9 + 2 + (long)sStack_93e * 2),1);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar9 + 2 + (long)sStack_93c * 2),2);
      auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)(lVar9 + 2 + (long)sStack_93a * 2),3);
      auVar5 = vpinsrw_avx(auVar5,0,4);
      auVar5 = vpinsrw_avx(auVar5,0,5);
      auVar5 = vpinsrw_avx(auVar5,0,6);
      auVar5 = vpinsrw_avx(auVar5,0,7);
      if (_bStack0000000000000008 == 0) {
        auVar6 = vpand_avx(auVar6,auVar2);
        local_8d0 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      else {
        auVar6 = vpsllw_avx(auVar6,ZEXT416(_bStack0000000000000008));
        auVar6 = vpand_avx(auVar6,auVar2);
        local_8d0 = vpsrlw_avx(auVar6,ZEXT416(1));
      }
      auVar6 = local_720._16_16_;
      local_720._0_16_ = ZEXT116(0) * auVar4 + ZEXT116(1) * local_720._0_16_;
      local_720._16_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar4;
      local_740._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * local_890;
      local_740._16_16_ = ZEXT116(0) * ZEXT816(0) + ZEXT116(1) * auVar5;
      local_840._0_16_ = ZEXT116(0) * local_8d0 + ZEXT116(1) * auVar17;
      local_840._16_16_ = ZEXT116(1) * local_8d0;
    }
    auVar8 = vpsubw_avx2(local_740,local_720._0_32_);
    auVar7 = vpsllw_avx2(local_720._0_32_,ZEXT416(5));
    auVar13._16_8_ = uStack_4d0;
    auVar13._0_16_ = auVar1;
    auVar13._24_8_ = uStack_4c8;
    auVar7 = vpaddw_avx2(auVar7,auVar13);
    auVar8 = vpmullw_avx2(auVar8,local_840);
    auVar7 = vpaddw_avx2(auVar7,auVar8);
    auVar7 = vpsrlw_avx2(auVar7,ZEXT416(5));
    auStack_810 = auVar7._16_16_;
    auVar17._8_8_ = uStack_858;
    auVar17._0_8_ = local_860;
    auVar17 = vpblendvb_avx(auStack_810,auVar17,*(undefined1 (*) [16])HighbdBaseMask[local_8a0]);
    local_870 = auVar17._0_8_;
    *local_6d0 = local_870;
    local_6d0 = (undefined8 *)(in_RDX * 2 + (long)local_6d0);
  }
  return;
}

Assistant:

static void highbd_dr_prediction_z2_Nx4_avx2(
    int N, uint16_t *dst, ptrdiff_t stride, const uint16_t *above,
    const uint16_t *left, int upsample_above, int upsample_left, int dx,
    int dy) {
  const int min_base_x = -(1 << upsample_above);
  const int min_base_y = -(1 << upsample_left);
  const int frac_bits_x = 6 - upsample_above;
  const int frac_bits_y = 6 - upsample_left;

  assert(dx > 0);
  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0_x, a1_x, a32, a16;
  __m256i diff;
  __m128i c3f, min_base_y128;

  a16 = _mm256_set1_epi16(16);
  c3f = _mm_set1_epi16(0x3f);
  min_base_y128 = _mm_set1_epi16(min_base_y);

  for (int r = 0; r < N; r++) {
    __m256i b, res, shift;
    __m128i resx, resy, resxy;
    __m128i a0_x128, a1_x128;
    int y = r + 1;
    int base_x = (-y * dx) >> frac_bits_x;
    int base_shift = 0;
    if (base_x < (min_base_x - 1)) {
      base_shift = (min_base_x - base_x - 1) >> upsample_above;
    }
    int base_min_diff =
        (min_base_x - base_x + upsample_above) >> upsample_above;
    if (base_min_diff > 4) {
      base_min_diff = 4;
    } else {
      if (base_min_diff < 0) base_min_diff = 0;
    }

    if (base_shift > 3) {
      a0_x = _mm256_setzero_si256();
      a1_x = _mm256_setzero_si256();
      shift = _mm256_setzero_si256();
    } else {
      a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
      if (upsample_above) {
        a0_x128 = _mm_shuffle_epi8(a0_x128,
                                   *(__m128i *)HighbdEvenOddMaskx4[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 8);

        shift = _mm256_castsi128_si256(_mm_srli_epi16(
            _mm_and_si128(
                _mm_slli_epi16(_mm_setr_epi16(-y * dx, (1 << 6) - y * dx,
                                              (2 << 6) - y * dx,
                                              (3 << 6) - y * dx, 0, 0, 0, 0),
                               upsample_above),
                c3f),
            1));
      } else {
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);
        a1_x128 = _mm_srli_si128(a0_x128, 2);

        shift = _mm256_castsi128_si256(_mm_srli_epi16(
            _mm_and_si128(
                _mm_setr_epi16(-y * dx, (1 << 6) - y * dx, (2 << 6) - y * dx,
                               (3 << 6) - y * dx, 0, 0, 0, 0),
                c3f),
            1));
      }
      a0_x = _mm256_castsi128_si256(a0_x128);
      a1_x = _mm256_castsi128_si256(a1_x128);
    }
    // y calc
    __m128i a0_y, a1_y, shifty;
    if (base_x < min_base_x) {
      __m128i r6, c1234, dy128, y_c128, base_y_c128, mask128;
      DECLARE_ALIGNED(32, int16_t, base_y_c[8]);
      r6 = _mm_set1_epi16(r << 6);
      dy128 = _mm_set1_epi16(dy);
      c1234 = _mm_setr_epi16(1, 2, 3, 4, 0, 0, 0, 0);
      y_c128 = _mm_sub_epi16(r6, _mm_mullo_epi16(c1234, dy128));
      base_y_c128 = _mm_srai_epi16(y_c128, frac_bits_y);
      mask128 = _mm_cmpgt_epi16(min_base_y128, base_y_c128);
      base_y_c128 = _mm_andnot_si128(mask128, base_y_c128);
      _mm_store_si128((__m128i *)base_y_c, base_y_c128);

      a0_y = _mm_setr_epi16(left[base_y_c[0]], left[base_y_c[1]],
                            left[base_y_c[2]], left[base_y_c[3]], 0, 0, 0, 0);
      a1_y = _mm_setr_epi16(left[base_y_c[0] + 1], left[base_y_c[1] + 1],
                            left[base_y_c[2] + 1], left[base_y_c[3] + 1], 0, 0,
                            0, 0);

      if (upsample_left) {
        shifty = _mm_srli_epi16(
            _mm_and_si128(_mm_slli_epi16(y_c128, upsample_left), c3f), 1);
      } else {
        shifty = _mm_srli_epi16(_mm_and_si128(y_c128, c3f), 1);
      }
      a0_x = _mm256_inserti128_si256(a0_x, a0_y, 1);
      a1_x = _mm256_inserti128_si256(a1_x, a1_y, 1);
      shift = _mm256_inserti128_si256(shift, shifty, 1);
    }

    diff = _mm256_sub_epi16(a1_x, a0_x);  // a[x+1] - a[x]
    a32 = _mm256_slli_epi16(a0_x, 5);     // a[x] * 32
    a32 = _mm256_add_epi16(a32, a16);     // a[x] * 32 + 16

    b = _mm256_mullo_epi16(diff, shift);
    res = _mm256_add_epi16(a32, b);
    res = _mm256_srli_epi16(res, 5);

    resx = _mm256_castsi256_si128(res);
    resy = _mm256_extracti128_si256(res, 1);
    resxy =
        _mm_blendv_epi8(resx, resy, *(__m128i *)HighbdBaseMask[base_min_diff]);
    _mm_storel_epi64((__m128i *)(dst), resxy);
    dst += stride;
  }
}